

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzerResults.cpp
# Opt level: O1

void __thiscall
HdlcAnalyzerResults::GenFlagFieldString(HdlcAnalyzerResults *this,Frame *frame,bool tabular)

{
  char *pcVar1;
  
  if (*(ulong *)(frame + 0x10) < 3) {
    pcVar1 = &DAT_0010f0fc + *(int *)(&DAT_0010f0fc + *(ulong *)(frame + 0x10) * 4);
  }
  else {
    pcVar1 = (char *)0x0;
  }
  if (tabular) {
    AnalyzerResults::AddTabularText
              ((char *)this,pcVar1," Flag Delimiter",(char *)0x0,(char *)0x0,(char *)0x0);
  }
  else {
    AnalyzerResults::AddResultString
              ((char *)this,"F",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"FL",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"FLAG",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,pcVar1," FLAG",(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,pcVar1," Flag Delimiter",(char *)0x0,(char *)0x0,(char *)0x0);
  }
  return;
}

Assistant:

void HdlcAnalyzerResults::GenFlagFieldString( const Frame& frame, bool tabular )
{
    char* flagTypeStr = 0;
    switch( frame.mData1 )
    {
    case HDLC_FLAG_START:
        flagTypeStr = "Start";
        break;
    case HDLC_FLAG_END:
        flagTypeStr = "End";
        break;
    case HDLC_FLAG_FILL:
        flagTypeStr = "Fill";
        break;
    }

    if( !tabular )
    {
        AddResultString( "F" );
        AddResultString( "FL" );
        AddResultString( "FLAG" );
        AddResultString( flagTypeStr, " FLAG" );
        AddResultString( flagTypeStr, " Flag Delimiter" );
    }
    else
        AddTabularText( flagTypeStr, " Flag Delimiter" );
}